

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_common.hpp
# Opt level: O0

spirv_cross * __thiscall
spirv_cross::join<char_const(&)[13],char_const*&,char_const(&)[18]>
          (spirv_cross *this,char (*ts) [13],char **ts_1,char (*ts_2) [18])

{
  undefined1 local_1118 [8];
  StringStream<4096UL,_4096UL> stream;
  char (*ts_local_2) [18];
  char **ts_local_1;
  char (*ts_local) [13];
  
  stream.saved_buffers.stack_storage.aligned_char._184_8_ = ts_2;
  StringStream<4096UL,_4096UL>::StringStream((StringStream<4096UL,_4096UL> *)local_1118);
  inner::join_helper<char_const(&)[13],char_const*&,char_const(&)[18]>
            ((StringStream<4096UL,_4096UL> *)local_1118,ts,ts_1,
             (char (*) [18])stream.saved_buffers.stack_storage.aligned_char._184_8_);
  StringStream<4096ul,4096ul>::str_abi_cxx11_((StringStream<4096ul,4096ul> *)this);
  StringStream<4096UL,_4096UL>::~StringStream((StringStream<4096UL,_4096UL> *)local_1118);
  return this;
}

Assistant:

std::string join(Ts &&... ts)
{
	StringStream<> stream;
	inner::join_helper(stream, std::forward<Ts>(ts)...);
	return stream.str();
}